

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modified.cpp
# Opt level: O0

void __thiscall
modified::modified(modified *this,vector<int,_std::allocator<int>_> *_removed,
                  vector<int,_std::allocator<int>_> *_vs,branch_and_reduce_algorithm *_pAlg)

{
  branch_and_reduce_algorithm *_pAlg_local;
  vector<int,_std::allocator<int>_> *_vs_local;
  vector<int,_std::allocator<int>_> *_removed_local;
  modified *this_local;
  
  this->_vptr_modified = (_func_int **)&PTR__modified_00164be0;
  this->add = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->removed);
  std::vector<int,_std::allocator<int>_>::vector(&this->vs);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->oldAdj);
  this->pAlg = _pAlg;
  this->foldingMapAdd = -1;
  std::vector<int,_std::allocator<int>_>::swap(&this->removed,_removed);
  std::vector<int,_std::allocator<int>_>::swap(&this->vs,_vs);
  return;
}

Assistant:

modified::modified(std::vector<int> &_removed, std::vector<int> &_vs, branch_and_reduce_algorithm *_pAlg)
: add(0)
, pAlg(_pAlg)
{
    removed.swap(_removed);
    vs.swap(_vs);
}